

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O3

uint64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getUIntUnchecked(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  uint64_t uVar2;
  
  bVar1 = **(byte **)this;
  if ((bVar1 & 0xf8) == 0x28) {
    uVar2 = (*(code *)(&DAT_0011b8c8 + *(int *)(&DAT_0011b8c8 + (ulong)(bVar1 - 0x28) * 4)))();
    return uVar2;
  }
  if ((byte)(bVar1 - 0x30) < 10) {
    return (ulong)(bVar1 & 0xf);
  }
  return 0;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }